

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::emit_atomic_func_op
          (CompilerMSL *this,uint32_t result_type,uint32_t result_id,char *op,Op opcode,
          uint32_t mem_order_1,uint32_t mem_order_2,bool has_mem_order_2,uint32_t obj,uint32_t op1,
          bool op1_is_pointer,bool op1_is_literal,uint32_t op2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32_t arg;
  bool bVar3;
  uint32_t id;
  BaseType BVar4;
  int iVar5;
  long *plVar6;
  SPIRType *pSVar7;
  SPIRVariable *pSVar8;
  SPIRType *pSVar9;
  undefined8 *puVar10;
  runtime_error *prVar11;
  size_type *psVar12;
  uint *ts_1;
  _Alloc_hider _Var13;
  bool bVar14;
  char (*in_stack_fffffffffffffde8) [2];
  string local_210;
  string exp;
  string local_1d0;
  BaseType local_1b0;
  uint32_t local_1ac;
  char *local_1a8;
  string local_1a0;
  SPIRType remapped_type;
  
  local_1ac = result_type;
  local_1a8 = op;
  ::std::__cxx11::string::string((string *)&remapped_type,op,(allocator *)&local_210);
  plVar6 = (long *)::std::__cxx11::string::append((char *)&remapped_type);
  exp._M_dataplus._M_p = (pointer)&exp.field_2;
  psVar12 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar12) {
    exp.field_2._M_allocated_capacity = *psVar12;
    exp.field_2._8_8_ = plVar6[3];
  }
  else {
    exp.field_2._M_allocated_capacity = *psVar12;
    exp._M_dataplus._M_p = (pointer)*plVar6;
  }
  exp._M_string_length = plVar6[1];
  *plVar6 = (long)psVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (remapped_type.super_IVariant._vptr_IVariant != (_func_int **)&remapped_type.width) {
    operator_delete(remapped_type.super_IVariant._vptr_IVariant);
  }
  pSVar7 = Compiler::expression_type((Compiler *)this,obj);
  pSVar7 = Compiler::get_pointee_type((Compiler *)this,pSVar7);
  if ((opcode & ~OpSourceContinued) == OpAtomicUMin) {
    BVar4 = to_unsigned_basetype(pSVar7->width);
  }
  else if ((opcode & ~OpSourceContinued) == OpAtomicSMin) {
    BVar4 = to_signed_basetype(pSVar7->width);
  }
  else {
    BVar4 = *(BaseType *)&(pSVar7->super_IVariant).field_0xc;
  }
  if (pSVar7->width == 0x40) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    remapped_type.super_IVariant._vptr_IVariant = (_func_int **)&remapped_type.width;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&remapped_type,"MSL currently does not support 64-bit atomics.","");
    ::std::runtime_error::runtime_error(prVar11,(string *)&remapped_type);
    *(undefined ***)prVar11 = &PTR__runtime_error_003d4e98;
    __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  SPIRType::SPIRType(&remapped_type,pSVar7);
  remapped_type.super_IVariant._12_4_ = BVar4;
  ::std::__cxx11::string::append((char *)&exp);
  pSVar8 = Compiler::maybe_get_backing_variable((Compiler *)this,obj);
  if (pSVar8 == (SPIRVariable *)0x0) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"No backing variable for atomic operation.","");
    ::std::runtime_error::runtime_error(prVar11,(string *)&local_210);
    *(undefined ***)prVar11 = &PTR__runtime_error_003d4e98;
    __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  pSVar9 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(pSVar8->super_IVariant).field_0xc);
  if ((pSVar9->storage == StorageClassUniformConstant) &&
     (*(int *)&(pSVar9->super_IVariant).field_0xc == 0x10)) {
    ::std::__cxx11::string::append((char *)&exp);
  }
  else {
    pSVar9 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(pSVar8->super_IVariant).field_0xc);
    get_type_address_space_abi_cxx11_(&local_210,this,pSVar9,(pSVar8->super_IVariant).self.id,true);
    ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_210._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  ::std::__cxx11::string::append((char *)&exp);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (&local_210,this,&remapped_type,0);
  ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_210._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)&exp);
  ::std::__cxx11::string::append((char *)&exp);
  ts_1 = (uint *)0x1;
  local_1b0 = BVar4;
  CompilerGLSL::to_enclosed_expression_abi_cxx11_(&local_210,&this->super_CompilerGLSL,obj,true);
  ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_210._M_dataplus._M_p);
  bVar3 = op1_is_pointer;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  id = op2;
  arg = op1;
  bVar14 = op1 != 0;
  iVar5 = strcmp(local_1a8,"atomic_compare_exchange_weak_explicit");
  if ((bVar3 & bVar14) == 1) {
    if (iVar5 != 0) {
      __assert_fail("strcmp(op, \"atomic_compare_exchange_weak_explicit\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2534,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    paVar1 = &local_210.field_2;
    if (id == 0) {
      __assert_fail("op2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2535,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (!has_mem_order_2) {
      __assert_fail("has_mem_order_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2536,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    ::std::__cxx11::string::append((char *)&exp);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_210,this,(ulong)result_id,1);
    ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_210._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)&exp);
    CompilerGLSL::to_expression_abi_cxx11_(&local_210,&this->super_CompilerGLSL,id,true);
    ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_210._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    CompilerGLSL::emit_uninitialized_temporary_expression
              (&this->super_CompilerGLSL,local_1ac,result_id);
    CompilerGLSL::statement<char_const(&)[3]>(&this->super_CompilerGLSL,(char (*) [3])"do");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_210,this,(ulong)result_id,1);
    CompilerGLSL::to_expression_abi_cxx11_(&local_1d0,&this->super_CompilerGLSL,op1,true);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_210,(char (*) [4])0x35bea6,&local_1d0,
               (char (*) [2])0x344553);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_1d0,this,(ulong)result_id,1);
    CompilerGLSL::to_enclosed_expression_abi_cxx11_(&local_1a0,&this->super_CompilerGLSL,op1,true);
    join<char_const(&)[9],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string,char_const(&)[5],std::__cxx11::string,char_const(&)[2]>
              (&local_210,(spirv_cross *)"while (!",(char (*) [9])&exp,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" && ",
               (char (*) [5])&local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" == ",
               (char (*) [5])&local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,
               in_stack_fffffffffffffde8);
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    goto LAB_002b00f9;
  }
  if (iVar5 == 0) {
    __assert_fail("strcmp(op, \"atomic_compare_exchange_weak_explicit\") != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                  ,0x254f,
                  "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                 );
  }
  paVar1 = &local_210.field_2;
  if (arg != 0) {
    if (op1_is_literal == false) {
      CompilerGLSL::bitcast_expression_abi_cxx11_
                (&local_1d0,&this->super_CompilerGLSL,local_1b0,arg);
      plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x35c44c);
      psVar12 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_210.field_2._M_allocated_capacity = *psVar12;
        local_210.field_2._8_8_ = plVar6[3];
        local_210._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar12;
        local_210._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_210._M_string_length = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_210._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      _Var13._M_p = local_1d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) goto LAB_002afe57;
    }
    else {
      join<char_const(&)[3],unsigned_int&>
                (&local_210,(spirv_cross *)0x35c44c,(char (*) [3])&op1,ts_1);
      ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_210._M_dataplus._M_p);
      _Var13._M_p = local_210._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
LAB_002afe57:
        operator_delete(_Var13._M_p);
      }
    }
  }
  if (id != 0) {
    CompilerGLSL::to_expression_abi_cxx11_(&local_1d0,&this->super_CompilerGLSL,id,true);
    puVar10 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x35c44c);
    psVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_210.field_2._M_allocated_capacity = *psVar12;
      local_210.field_2._8_8_ = puVar10[3];
      local_210._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar12;
      local_210._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_210._M_string_length = puVar10[1];
    *puVar10 = psVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_210._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
  }
  paVar2 = &local_1d0.field_2;
  local_1d0._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,", ","");
  puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1d0);
  psVar12 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_210.field_2._M_allocated_capacity = *psVar12;
    local_210.field_2._8_8_ = puVar10[3];
    local_210._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar12;
    local_210._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_210._M_string_length = puVar10[1];
  *puVar10 = psVar12;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_210._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (has_mem_order_2) {
    local_1d0._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,", ","");
    puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1d0);
    psVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_210.field_2._M_allocated_capacity = *psVar12;
      local_210.field_2._8_8_ = puVar10[3];
      local_210._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar12;
      local_210._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_210._M_string_length = puVar10[1];
    *puVar10 = psVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_210._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
  }
  ::std::__cxx11::string::append((char *)&exp);
  if (local_1b0 != *(BaseType *)&(pSVar7->super_IVariant).field_0xc) {
    CompilerGLSL::bitcast_expression(&local_210,&this->super_CompilerGLSL,pSVar7,local_1b0,&exp);
    ::std::__cxx11::string::operator=((string *)&exp,(string *)&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  iVar5 = strcmp(local_1a8,"atomic_store_explicit");
  if (iVar5 == 0) {
    CompilerGLSL::statement<std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,&exp,(char (*) [2])0x344553);
  }
  else {
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,local_1ac,result_id,&exp,false,false);
  }
LAB_002b00f9:
  Compiler::flush_all_atomic_capable_variables((Compiler *)this);
  remapped_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003d5290;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&remapped_type.member_name_cache._M_h);
  remapped_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      remapped_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &remapped_type.member_type_index_redirection.stack_storage) {
    free(remapped_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  remapped_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      remapped_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
      != &remapped_type.member_types.stack_storage) {
    free(remapped_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
         ptr);
  }
  remapped_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)remapped_type.array_size_literal.super_VectorView<bool>.ptr !=
      &remapped_type.array_size_literal.stack_storage) {
    free(remapped_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  remapped_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)remapped_type.array.super_VectorView<unsigned_int>.ptr !=
      &remapped_type.array.stack_storage) {
    free(remapped_type.array.super_VectorView<unsigned_int>.ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exp._M_dataplus._M_p != &exp.field_2) {
    operator_delete(exp._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id, const char *op, Op opcode,
                                      uint32_t mem_order_1, uint32_t mem_order_2, bool has_mem_order_2, uint32_t obj, uint32_t op1,
                                      bool op1_is_pointer, bool op1_is_literal, uint32_t op2)
{
	string exp = string(op) + "(";

	auto &type = get_pointee_type(expression_type(obj));
	auto expected_type = type.basetype;
	if (opcode == OpAtomicUMax || opcode == OpAtomicUMin)
		expected_type = to_unsigned_basetype(type.width);
	else if (opcode == OpAtomicSMax || opcode == OpAtomicSMin)
		expected_type = to_signed_basetype(type.width);

	if (type.width == 64)
		SPIRV_CROSS_THROW("MSL currently does not support 64-bit atomics.");

	auto remapped_type = type;
	remapped_type.basetype = expected_type;

	exp += "(";
	auto *var = maybe_get_backing_variable(obj);
	if (!var)
		SPIRV_CROSS_THROW("No backing variable for atomic operation.");

	// Emulate texture2D atomic operations
	const auto &res_type = get<SPIRType>(var->basetype);
	if (res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image)
	{
		exp += "device";
	}
	else
	{
		exp += get_argument_address_space(*var);
	}

	exp += " atomic_";
	// For signed and unsigned min/max, we can signal this through the pointer type.
	// There is no other way, since C++ does not have explicit signage for atomics.
	exp += type_to_glsl(remapped_type);
	exp += "*)";

	exp += "&";
	exp += to_enclosed_expression(obj);

	bool is_atomic_compare_exchange_strong = op1_is_pointer && op1;

	if (is_atomic_compare_exchange_strong)
	{
		assert(strcmp(op, "atomic_compare_exchange_weak_explicit") == 0);
		assert(op2);
		assert(has_mem_order_2);
		exp += ", &";
		exp += to_name(result_id);
		exp += ", ";
		exp += to_expression(op2);
		exp += ", ";
		exp += get_memory_order(mem_order_1);
		exp += ", ";
		exp += get_memory_order(mem_order_2);
		exp += ")";

		// MSL only supports the weak atomic compare exchange, so emit a CAS loop here.
		// The MSL function returns false if the atomic write fails OR the comparison test fails,
		// so we must validate that it wasn't the comparison test that failed before continuing
		// the CAS loop, otherwise it will loop infinitely, with the comparison test always failing.
		// The function updates the comparitor value from the memory value, so the additional
		// comparison test evaluates the memory value against the expected value.
		emit_uninitialized_temporary_expression(result_type, result_id);
		statement("do");
		begin_scope();
		statement(to_name(result_id), " = ", to_expression(op1), ";");
		end_scope_decl(join("while (!", exp, " && ", to_name(result_id), " == ", to_enclosed_expression(op1), ")"));
	}
	else
	{
		assert(strcmp(op, "atomic_compare_exchange_weak_explicit") != 0);
		if (op1)
		{
			if (op1_is_literal)
				exp += join(", ", op1);
			else
				exp += ", " + bitcast_expression(expected_type, op1);
		}
		if (op2)
			exp += ", " + to_expression(op2);

		exp += string(", ") + get_memory_order(mem_order_1);
		if (has_mem_order_2)
			exp += string(", ") + get_memory_order(mem_order_2);

		exp += ")";

		if (expected_type != type.basetype)
			exp = bitcast_expression(type, expected_type, exp);

		if (strcmp(op, "atomic_store_explicit") != 0)
			emit_op(result_type, result_id, exp, false);
		else
			statement(exp, ";");
	}

	flush_all_atomic_capable_variables();
}